

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O3

ostream * __thiscall
bhf::ads::TcLicenseOnlineInfo::ShowStatus(TcLicenseOnlineInfo *this,ostream *os)

{
  _Rb_tree_color _Var1;
  char *pcVar2;
  int iVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  long lVar7;
  bool bVar8;
  initializer_list<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_d2;
  less<unsigned_int> local_d1;
  int local_d0 [4];
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if ((ShowStatus(std::ostream&)::states_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ShowStatus(std::ostream&)::states_abi_cxx11_), iVar3 != 0)) {
    local_d0[3] = 0;
    std::
    pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<int,_const_char_(&)[6],_true>(&local_c0,local_d0 + 3,(char (*) [6])"Valid");
    local_d0[2] = 0x203;
    std::
    pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<int,_const_char_(&)[16],_true>(&local_98,local_d0 + 2,(char (*) [16])"Valid (Pending)");
    local_d0[1] = 0x254;
    std::
    pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<int,_const_char_(&)[14],_true>(&local_70,local_d0 + 1,(char (*) [14])"Valid (Trial)");
    local_d0[0] = 0x255;
    std::
    pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<int,_const_char_(&)[12],_true>(&local_48,local_d0,(char (*) [12])"Valid (OEM)");
    __l._M_len = 4;
    __l._M_array = &local_c0;
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&ShowStatus(std::ostream&)::states_abi_cxx11_,__l,&local_d1,&local_d2);
    lVar7 = 0;
    do {
      pcVar2 = *(char **)((long)&local_48.second._M_dataplus._M_p + lVar7);
      if (local_48.second.field_2._M_local_buf + lVar7 != pcVar2) {
        operator_delete(pcVar2);
      }
      lVar7 = lVar7 + -0x28;
    } while (lVar7 != -0xa0);
    __cxa_atexit(std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&ShowStatus(std::ostream&)::states_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ShowStatus(std::ostream&)::states_abi_cxx11_);
  }
  if (ShowStatus(std::ostream&)::states_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent != (_Base_ptr)0x0) {
    p_Var4 = &ShowStatus(std::ostream&)::states_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    _Var1 = this->nResult;
    p_Var6 = ShowStatus(std::ostream&)::states_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
    do {
      bVar8 = p_Var6[1]._M_color < _Var1;
      if (!bVar8) {
        p_Var4 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar8];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 !=
         &ShowStatus(std::ostream&)::states_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
       (p_Var4[1]._M_color <= _Var1)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)p_Var4[1]._M_parent,(long)p_Var4[1]._M_left);
      return poVar5;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  return poVar5;
}

Assistant:

std::ostream& ShowStatus(std::ostream& os) const
    {
        static const std::map<uint32_t, std::string> states = {
            { 0, "Valid" },
            { 515, "Valid (Pending)" },
            { 596, "Valid (Trial)" },
            { 597, "Valid (OEM)" },
        };
        const auto it = states.find(nResult);
        if (states.end() != it) {
            return os << it->second;
        }
        return os << "0x" << std::hex << nResult;
    }